

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O1

string * cmGeneratorExpression::Preprocess
                   (string *__return_storage_ptr__,string *input,PreprocessContext context,
                   bool resolveRelative)

{
  pointer pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  pointer pcVar4;
  undefined8 uVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  size_type sVar9;
  undefined8 *puVar10;
  long lVar11;
  undefined7 in_register_00000009;
  size_type *psVar12;
  int iVar13;
  char cVar14;
  char *pcVar15;
  pointer pbVar16;
  string *e;
  char *pcVar17;
  ulong uVar18;
  char *pcVar19;
  string *psVar20;
  ulong uVar21;
  bool bVar22;
  string content;
  string result;
  string local_e0;
  string *local_c0;
  pointer *local_b8;
  pointer local_b0;
  pointer local_a8 [2];
  string local_98;
  undefined1 local_78 [40];
  ulong local_50;
  undefined4 local_48;
  PreprocessContext local_44;
  string *local_40;
  long local_38;
  
  local_48 = (undefined4)CONCAT71(in_register_00000009,resolveRelative);
  local_c0 = input;
  local_40 = __return_storage_ptr__;
  if (context == StripAllGeneratorExpressions) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    lVar11 = std::__cxx11::string::find((char *)input,0x575734,0);
    if (lVar11 == -1) {
      bVar6 = true;
    }
    else {
      paVar2 = &local_e0.field_2;
      psVar20 = local_c0;
      do {
        std::__cxx11::string::substr((ulong)&local_e0,(ulong)psVar20);
        std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_e0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        pcVar19 = (local_c0->_M_dataplus)._M_p + lVar11 + 2;
        cVar14 = *pcVar19;
        bVar22 = cVar14 == '\0';
        pcVar17 = pcVar19;
        if (bVar22) {
          bVar6 = false;
        }
        else {
          iVar13 = 1;
          do {
            if (cVar14 == '>') {
              iVar13 = iVar13 + -1;
              if (iVar13 == 0) {
                iVar13 = 0;
                break;
              }
            }
            else if ((cVar14 == '$') && (pcVar17[1] == '<')) {
              pcVar17 = pcVar17 + 1;
              iVar13 = iVar13 + 1;
            }
            cVar14 = pcVar17[1];
            pcVar17 = pcVar17 + 1;
            bVar22 = cVar14 == '\0';
          } while (!bVar22);
          bVar6 = iVar13 == 0;
        }
        if (bVar22) {
          std::__cxx11::string::substr((ulong)&local_b8,(ulong)local_c0);
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x575734);
          psVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_e0.field_2._M_allocated_capacity = *psVar12;
            local_e0.field_2._8_8_ = puVar10[3];
            local_e0._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *psVar12;
            local_e0._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_e0._M_string_length = puVar10[1];
          *puVar10 = psVar12;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_e0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8,(ulong)((long)&(local_a8[0]->_M_dataplus)._M_p + 1));
          }
        }
        psVar20 = local_c0;
        lVar11 = std::__cxx11::string::find
                           ((char *)local_c0,0x575734,
                            (ulong)(pcVar17 + ((lVar11 + 3) - (long)pcVar19)));
      } while (lVar11 != -1);
    }
    psVar20 = local_40;
    if (bVar6) {
      std::__cxx11::string::substr((ulong)&local_e0,(ulong)local_c0);
      std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
    }
    StripEmptyListElements(psVar20,&local_98);
  }
  else {
    local_44 = context;
    if (InstallInterface < context) {
      __assert_fail("false && \"cmGeneratorExpression::Preprocess called with invalid args\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorExpression.cxx"
                    ,0x15a,
                    "static std::string cmGeneratorExpression::Preprocess(const std::string &, PreprocessContext, bool)"
                   );
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    pcVar17 = (char *)0x0;
    iVar13 = 0;
    do {
      uVar7 = std::__cxx11::string::find((char *)input,0x54f9e1,(ulong)pcVar17);
      uVar8 = std::__cxx11::string::find((char *)input,0x56a60f,(ulong)pcVar17);
      uVar18 = uVar8 & uVar7;
      if (uVar18 != 0xffffffffffffffff) {
        uVar21 = uVar8;
        if (uVar7 < uVar8) {
          uVar21 = uVar7;
        }
        if (uVar8 == 0xffffffffffffffff) {
          uVar21 = uVar7;
        }
        if (uVar7 == 0xffffffffffffffff) {
          uVar21 = uVar8;
        }
        std::__cxx11::string::substr((ulong)&local_e0,(ulong)input);
        std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_e0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        pcVar4 = (input->_M_dataplus)._M_p;
        cVar14 = pcVar4[uVar21 + 2];
        lVar11 = (ulong)(cVar14 == 'I') * 2 + 0x12;
        uVar7 = uVar21 + (ulong)(cVar14 == 'I') * 2 + 0x12;
        iVar13 = 1;
        pcVar19 = pcVar4 + uVar7;
        for (pcVar17 = pcVar19; cVar3 = *pcVar17, cVar3 == '$'; pcVar17 = pcVar17 + 1) {
          if (pcVar17[1] == '<') {
            pcVar17 = pcVar17 + 1;
            iVar13 = iVar13 + 1;
          }
LAB_00336d98:
        }
        if (cVar3 == '>') {
          iVar13 = iVar13 + -1;
          if (iVar13 != 0) goto LAB_00336d98;
          if ((local_44 == BuildInterface) && (cVar14 != 'I')) {
            local_50 = uVar18;
            std::__cxx11::string::substr((ulong)&local_e0,(ulong)local_c0);
            std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_e0._M_dataplus._M_p);
            uVar18 = local_50;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
              uVar18 = local_50;
            }
          }
          else {
            iVar13 = 0;
            if ((local_44 != InstallInterface) || (cVar14 != 'I')) goto LAB_00336fbc;
            local_50 = uVar7;
            local_38 = lVar11;
            std::__cxx11::string::substr((ulong)&local_e0,(ulong)local_c0);
            if ((char)local_48 == '\0') {
              std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_e0._M_dataplus._M_p);
            }
            else {
              local_b8 = local_a8;
              local_78._0_8_ = (pointer)0x12;
              local_b8 = (pointer *)
                         std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)local_78);
              local_a8[0] = (pointer)local_78._0_8_;
              *local_b8 = (pointer)0x524f504d495f7b24;
              local_b8[1] = (pointer)0x5849464552505f54;
              *(undefined2 *)(local_b8 + 2) = 0x2f7d;
              local_b0 = (pointer)local_78._0_8_;
              *(char *)((long)local_b8 + local_78._0_8_) = '\0';
              local_78._0_8_ = (string *)0x0;
              local_78._8_8_ = (string *)0x0;
              local_78._16_8_ = (pointer)0x0;
              Split(&local_e0,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_78);
              uVar5 = local_78._8_8_;
              for (psVar20 = (string *)local_78._0_8_; psVar20 != (string *)uVar5;
                  psVar20 = psVar20 + 1) {
                std::__cxx11::string::append((char *)&local_98);
                bVar6 = cmsys::SystemTools::FileIsFullPath(psVar20);
                if ((!bVar6) && (sVar9 = Find(psVar20), sVar9 != 0)) {
                  std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_b8);
                }
                std::__cxx11::string::_M_append
                          ((char *)&local_98,(ulong)(psVar20->_M_dataplus)._M_p);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_78);
              if (local_b8 != local_a8) {
                operator_delete(local_b8,(ulong)((long)&(local_a8[0]->_M_dataplus)._M_p + 1));
              }
            }
            lVar11 = local_38;
            uVar7 = local_50;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
              lVar11 = local_38;
              uVar7 = local_50;
            }
          }
          iVar13 = 0;
        }
        else if (cVar3 != '\0') goto LAB_00336d98;
LAB_00336fbc:
        input = local_c0;
        if (*pcVar17 == '\0') {
          pcVar15 = "$<BUILD_INTERFACE:";
          if (cVar14 == 'I') {
            pcVar15 = "$<INSTALL_INTERFACE:";
          }
          local_b8 = local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,pcVar15,pcVar15 + lVar11);
          std::__cxx11::string::substr((ulong)local_78,(ulong)input);
          pbVar16 = (pointer)0xf;
          if (local_b8 != local_a8) {
            pbVar16 = local_a8[0];
          }
          pbVar1 = (pointer)((long)&((_Alloc_hider *)local_78._8_8_)->_M_p +
                            (long)&(local_b0->_M_dataplus)._M_p);
          if (pbVar16 < pbVar1) {
            pbVar16 = (pointer)0xf;
            if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
              pbVar16 = (pointer)local_78._16_8_;
            }
            if (pbVar16 < pbVar1) goto LAB_00337062;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,(ulong)local_b8);
          }
          else {
LAB_00337062:
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_b8,local_78._0_8_);
          }
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          psVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_e0.field_2._M_allocated_capacity = *psVar12;
            local_e0.field_2._8_8_ = puVar10[3];
          }
          else {
            local_e0.field_2._M_allocated_capacity = *psVar12;
            local_e0._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_e0._M_string_length = puVar10[1];
          *puVar10 = psVar12;
          puVar10[1] = 0;
          *(undefined1 *)psVar12 = 0;
          std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_e0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_78._16_8_)->_M_p + 1));
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8,(ulong)((long)&(local_a8[0]->_M_dataplus)._M_p + 1));
          }
        }
        pcVar17 = pcVar17 + uVar7 + (1 - (long)pcVar19);
      }
      psVar20 = local_40;
    } while (uVar18 != 0xffffffffffffffff);
    if (iVar13 == 0) {
      std::__cxx11::string::substr((ulong)&local_e0,(ulong)local_c0);
      std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
    }
    StripEmptyListElements(psVar20,&local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return psVar20;
}

Assistant:

std::string cmGeneratorExpression::Preprocess(const std::string& input,
                                              PreprocessContext context,
                                              bool resolveRelative)
{
  if (context == StripAllGeneratorExpressions) {
    return stripAllGeneratorExpressions(input);
  }
  if (context == BuildInterface || context == InstallInterface) {
    return stripExportInterface(input, context, resolveRelative);
  }

  assert(false &&
         "cmGeneratorExpression::Preprocess called with invalid args");
  return std::string();
}